

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O0

int64_t aom_sse_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  int32_t diff;
  int64_t sse;
  int x;
  int y;
  int height_local;
  int width_local;
  int b_stride_local;
  uint8_t *b_local;
  int a_stride_local;
  uint8_t *a_local;
  
  sse = 0;
  b_local = b;
  a_local = a;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = (uint)a_local[x] - (uint)b_local[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sse = iVar1 * iVar1 + sse;
    }
    a_local = a_local + a_stride;
    b_local = b_local + b_stride;
  }
  return sse;
}

Assistant:

int64_t aom_sse_c(const uint8_t *a, int a_stride, const uint8_t *b,
                  int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = abs(a[x] - b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}